

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

int __thiscall CMU462::Application::init(Application *this,EVP_PKEY_CTX *ctx)

{
  Scene *this_00;
  int extraout_EAX;
  undefined1 local_a8 [8];
  CameraInfo cameraInfo;
  float fStack_18;
  float fStack_14;
  Application *this_local;
  
  if (this->scene != (Scene *)0x0) {
    this_00 = this->scene;
    if (this_00 != (Scene *)0x0) {
      DynamicScene::Scene::~Scene(this_00);
      operator_delete(this_00,0x128);
    }
    this->scene = (Scene *)0x0;
  }
  OSDText::init(&this->textManager,(EVP_PKEY_CTX *)(ulong)((this->super_Renderer).use_hdpi & 1));
  Color::Color((Color *)&cameraInfo.nClip,1.0,1.0,1.0,1.0);
  (this->text_color).r = cameraInfo.nClip;
  (this->text_color).g = cameraInfo.fClip;
  (this->text_color).b = fStack_18;
  (this->text_color).a = fStack_14;
  this->leftDown = false;
  this->rightDown = false;
  this->middleDown = false;
  this->show_coordinates = true;
  this->show_hud = true;
  glEnable(0xb50);
  glEnable(0xb20);
  glEnable(0xb10);
  glHint(0xc52);
  glHint(0xc51,0x1102);
  initialize_style(this);
  *(undefined4 *)&(this->super_Renderer).field_0xc = 0;
  this->action = Navigate;
  this->scene = (Scene *)0x0;
  this->screenH = 600;
  this->screenW = 600;
  Collada::CameraInfo::CameraInfo((CameraInfo *)local_a8);
  cameraInfo.up_dir.z._0_4_ = 0x41a00000;
  cameraInfo.up_dir.z._4_4_ = 0x41e00000;
  cameraInfo.hFov = 0.1;
  cameraInfo.vFov = 100.0;
  Camera::configure(&this->camera,(CameraInfo *)local_a8,this->screenW,this->screenH);
  Camera::configure(&this->canonicalCamera,(CameraInfo *)local_a8,this->screenW,this->screenH);
  Timeline::setMaxFrame(&this->timeline,300);
  Timeline::action_rewind(&this->timeline);
  Timeline::resize(&this->timeline,(int)this->screenW,0x40);
  Timeline::move(&this->timeline,0,(int)this->screenH + -0x40);
  Timeline::markTime(&this->timeline,0);
  Collada::CameraInfo::~CameraInfo((CameraInfo *)local_a8);
  return extraout_EAX;
}

Assistant:

void Application::init()
{
   if( scene != nullptr )
   {
      delete scene;
      scene = nullptr;
   }

   textManager.init(use_hdpi);
   text_color = Color(1.0, 1.0, 1.0);

   // Setup all the basic internal state to default values,
   // as well as some basic OpenGL state (like depth testing
   // and lighting).

   // Set the integer bit vector representing which keys are down.
   leftDown   = false;
   rightDown  = false;
   middleDown = false;

   show_coordinates = true;
   show_hud = true;

   // Lighting needs to be explicitly enabled.
   glEnable(GL_LIGHTING);

   // Enable anti-aliasing and circular points.
   glEnable( GL_LINE_SMOOTH );
   // glEnable( GL_POLYGON_SMOOTH ); // XXX causes cracks!
   glEnable(GL_POINT_SMOOTH);
   glHint( GL_LINE_SMOOTH_HINT, GL_NICEST );
   // glHint( GL_POLYGON_SMOOTH_HINT, GL_NICEST );
   glHint(GL_POINT_SMOOTH_HINT,GL_NICEST);

   // Initialize styles (colors, line widths, etc.) that will be used
   // to draw different types of mesh elements in various situations.
   initialize_style();

   mode = MODEL_MODE;
   action = Action::Navigate;
   scene = nullptr;

   // Make a dummy camera so resize() doesn't crash before the scene has been
   // loaded.
   // NOTE: there's a chicken-and-egg problem here, because load()
   // requires init, and init requires init_camera (which is only called by
   // load()).
   screenW = screenH = 600; // Default value
   CameraInfo cameraInfo;
   cameraInfo.hFov = 20;
   cameraInfo.vFov = 28;
   cameraInfo.nClip = 0.1;
   cameraInfo.fClip = 100;
   camera.configure(cameraInfo, screenW, screenH);
   canonicalCamera.configure(cameraInfo, screenW, screenH);

   // Now initialize the timeline
   timeline.setMaxFrame(300);
   timeline.action_rewind();
   timeline.resize(screenW, 64);
   timeline.move(0, screenH - 64);
   timeline.markTime(0);
}